

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O3

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  int32_t iVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  spv_result_t sVar9;
  uint32_t uVar10;
  uint uVar11;
  Op OVar12;
  uint32_t uVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  DiagnosticStream *pDVar17;
  long lVar18;
  char *pcVar19;
  size_t sVar20;
  size_t operand_index;
  ulong uVar21;
  uint32_t member_type;
  uint32_t result_num_cols;
  uint32_t result_component_type;
  uint32_t matrix_component_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t result_num_rows;
  uint32_t matrix_col_type;
  uint32_t local_25c;
  char *local_258;
  uint32_t local_250;
  uint32_t local_24c;
  uint32_t local_248;
  uint32_t local_244;
  uint32_t local_240;
  uint32_t local_23c;
  string local_238;
  ulong local_218;
  uint32_t local_20c;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x4d:
    uVar8 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
    iVar5 = spvOpcodeIsScalarType(OVar12);
    if (iVar5 == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a scalar type";
LAB_002c259b:
      lVar18 = 0x28;
    }
    else {
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
      if (OVar12 != OpTypeVector) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector type to be OpTypeVector";
        goto LAB_002c262e;
      }
      uVar10 = ValidationState_t::GetComponentType(_,uVar10);
      if (uVar10 == uVar8) {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar14 = ValidationState_t::FindDef(_,uVar6);
        if (((pIVar14 == (Instruction *)0x0) || (uVar8 = (pIVar14->inst_).type_id, uVar8 == 0)) ||
           (bVar4 = ValidationState_t::IsIntScalarType(_,uVar8), !bVar4)) {
LAB_002c26ae:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Expected Index to be int scalar";
          lVar18 = 0x1f;
        }
        else {
          bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Cannot extract from a vector of 8- or 16-bit types";
          lVar18 = 0x32;
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector component type to be equal to Result Type";
        lVar18 = 0x39;
      }
    }
    break;
  case 0x4e:
    uVar8 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
    if (OVar12 == OpTypeVector) {
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      if (uVar10 == uVar8) {
        uVar10 = ValidationState_t::GetOperandTypeId(_,inst,3);
        uVar8 = ValidationState_t::GetComponentType(_,uVar8);
        if (uVar8 == uVar10) {
          uVar8 = ValidationState_t::GetOperandTypeId(_,inst,4);
          bVar4 = ValidationState_t::IsIntScalarType(_,uVar8);
          if (!bVar4) goto LAB_002c26ae;
          bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Cannot insert into a vector of 8- or 16-bit types";
          lVar18 = 0x31;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Expected Component type to be equal to Result Type ",
                     0x33);
          pcVar19 = "component type";
          lVar18 = 0xe;
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector type to be equal to Result Type";
LAB_002c26a4:
        lVar18 = 0x2f;
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be OpTypeVector";
LAB_002c262e:
      lVar18 = 0x27;
    }
    break;
  case 0x4f:
    pIVar14 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"The Result Type of OpVectorShuffle must be",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," OpTypeVector. Found Op",0x17);
      local_238._M_dataplus._M_p = spvOpcodeString((uint)(pIVar14->inst_).opcode);
      pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,".",1);
      local_208.error_ = pDVar17->error_;
      goto LAB_002c2dd2;
    }
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    psVar3 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
    if (((long)psVar2 - (long)psVar3 >> 4) - 4U != (ulong)uVar6) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 "OpVectorShuffle component literals count does not match Result Type <id> ",0x49);
      ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar14->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"s vector component count.",0x19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002c2dd2;
    }
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar15 = ValidationState_t::FindDef(_,uVar6);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar16 = ValidationState_t::FindDef(_,uVar6);
    pIVar16 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
    if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "The type of Vector 1 must be OpTypeVector.";
    }
    else {
      if ((pIVar16 != (Instruction *)0x0) && ((pIVar16->inst_).opcode == 0x17)) {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        if (uVar11 == uVar6) {
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
          if (uVar11 == uVar6) {
            uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
            uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
            if (0x40 < (ulong)((long)(inst->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              sVar20 = 4;
              do {
                uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar20);
                if ((uVar7 != 0xffffffff) && (uVar11 + uVar6 <= uVar7)) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Component index ",0x10);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208," is out of bounds for ",0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"combined (Vector1 + Vector2) size of ",0x25);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
                  goto LAB_002c2dd2;
                }
                sVar20 = sVar20 + 1;
              } while (sVar20 < (ulong)((long)(inst->operands_).
                                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(inst->operands_).
                                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
            if (!bVar4) {
              return SPV_SUCCESS;
            }
            bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar4) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Cannot shuffle a vector of 8- or 16-bit types";
            lVar18 = 0x2d;
            break;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "The Component Type of Vector 2 must be the same as ResultType.";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "The Component Type of Vector 1 must be the same as ResultType.";
        }
        lVar18 = 0x3e;
        break;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "The type of Vector 2 must be OpTypeVector.";
    }
    goto LAB_002c2d81;
  case 0x50:
    uVar21 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    uVar8 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
    uVar6 = (uint)uVar21;
    switch(OVar12) {
    case OpTypeVector:
      uVar10 = ValidationState_t::GetDimension(_,uVar8);
      local_250 = ValidationState_t::GetComponentType(_,uVar8);
      if (uVar6 < 4) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected number of constituents to be at least 2";
        lVar18 = 0x30;
      }
      else {
        local_218 = uVar21 & 0xffffffff;
        uVar8 = 0;
        sVar20 = 2;
        local_248 = uVar10;
        do {
          uVar10 = ValidationState_t::GetOperandTypeId(_,inst,sVar20);
          uVar13 = 1;
          if (uVar10 != local_250) {
            OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
            if ((OVar12 != OpTypeVector) ||
               (uVar13 = ValidationState_t::GetComponentType(_,uVar10), uVar13 != local_250)) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Expected Constituents to be scalars or vectors of",
                         0x31);
              pcVar19 = " the same type as Result Type components";
              goto LAB_002c259b;
            }
            uVar13 = ValidationState_t::GetDimension(_,uVar10);
          }
          uVar8 = uVar8 + uVar13;
          sVar20 = sVar20 + 1;
        } while (local_218 != sVar20);
        if (local_248 == uVar8) goto LAB_002c2c3c;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected total number of given components to be equal ",
                   0x36);
        pcVar19 = "to the size of Result Type vector";
        lVar18 = 0x21;
      }
      break;
    case OpTypeMatrix:
      local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
      local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
      local_25c = 0;
      local_24c = 0;
      bVar4 = ValidationState_t::GetMatrixTypeInfo
                        (_,uVar8,(uint32_t *)&local_238,(uint32_t *)&local_258,&local_25c,&local_24c
                        );
      if (!bVar4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x103,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((uint32_t)local_258 + 2 == uVar6) {
        if (2 < uVar6) {
          sVar20 = 2;
          do {
            uVar8 = ValidationState_t::GetOperandTypeId(_,inst,sVar20);
            if (uVar8 != local_25c) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Constituent type to be equal to the column ",0x34);
              pcVar19 = "type Result Type matrix";
              lVar18 = 0x17;
              goto LAB_002c2dc0;
            }
            sVar20 = sVar20 + 1;
          } while ((uVar21 & 0xffffffff) != sVar20);
        }
        goto LAB_002c2c3c;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Expected total number of Constituents to be equal ",0x32);
      pcVar19 = "to the number of columns of Result Type matrix";
LAB_002c2dbb:
      lVar18 = 0x2e;
      break;
    case OpTypeImage:
    case OpTypeSampler:
    case OpTypeSampledImage:
    case OpTypeRuntimeArray:
switchD_002c20da_caseD_19:
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a composite type";
LAB_002c2753:
      lVar18 = 0x2b;
      break;
    case OpTypeArray:
      pIVar14 = ValidationState_t::FindDef(_,uVar8);
      if (pIVar14 == (Instruction *)0x0) {
        __assert_fail("array_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x11a,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar14->inst_).opcode != 0x1c) {
        __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x11b,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      pIVar15 = ValidationState_t::FindDef
                          (_,(pIVar14->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3]);
      iVar5 = spvOpcodeIsSpecConstant((uint)(pIVar15->inst_).opcode);
      if (iVar5 == 0) {
        local_238._M_dataplus._M_p = (char *)0x0;
        bVar4 = ValidationState_t::EvalConstantValUint64
                          (_,(pIVar14->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3],(uint64_t *)&local_238);
        if (!bVar4) {
          __assert_fail("0 && \"Array type definition is corrupt\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x125,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if (local_238._M_dataplus._M_p + 2 != (char *)(uVar21 & 0xffffffff)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Expected total number of Constituents to be equal ",0x32
                    );
          pcVar19 = "to the number of elements of Result Type array";
          goto LAB_002c2dbb;
        }
        if (2 < uVar6) {
          uVar8 = (pIVar14->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[2];
          pcVar19 = (char *)0x2;
          do {
            uVar10 = ValidationState_t::GetOperandTypeId(_,inst,(size_t)pcVar19);
            if (uVar10 != uVar8) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Constituent type to be equal to the column ",0x34);
              pcVar19 = "type Result Type array";
              lVar18 = 0x16;
              goto LAB_002c2dc0;
            }
            pcVar19 = pcVar19 + 1;
          } while ((char *)(uVar21 & 0xffffffff) != pcVar19);
        }
      }
      goto LAB_002c2c3c;
    case OpTypeStruct:
      pIVar14 = ValidationState_t::FindDef(_,uVar8);
      if (pIVar14 == (Instruction *)0x0) {
        __assert_fail("struct_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x13d,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar14->inst_).opcode != 0x1e) {
        __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x13e,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      sVar20 = (long)(pIVar14->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar14->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (sVar20 + 1 != (uVar21 & 0xffffffff)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected total number of Constituents to be equal ",0x32);
        pcVar19 = "to the number of members of Result Type struct";
        goto LAB_002c2dbb;
      }
      if (2 < uVar6) {
        operand_index = 2;
        do {
          uVar8 = ValidationState_t::GetOperandTypeId(_,inst,operand_index);
          if (uVar8 != (pIVar14->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[operand_index]) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Expected Constituent type to be equal to the ",0x2d);
            pcVar19 = "corresponding member type of Result Type struct";
            goto LAB_002c26a4;
          }
          bVar4 = operand_index != sVar20;
          operand_index = operand_index + 1;
        } while (bVar4);
      }
LAB_002c2c3c:
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Cannot create a composite containing 8- or 16-bit types";
      lVar18 = 0x37;
      break;
    default:
      if (OVar12 == OpTypeCooperativeMatrixKHR) {
        pIVar14 = ValidationState_t::FindDef(_,uVar8);
        if (pIVar14 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x155,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        if (uVar6 == 3) {
LAB_002c2a6f:
          uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
          if (uVar8 == uVar11) goto LAB_002c2c3c;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Expected Constituent type to be equal to the component type";
          lVar18 = 0x3b;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Must be only one constituent";
          lVar18 = 0x1c;
        }
      }
      else {
        if (OVar12 != OpTypeCooperativeMatrixNV) goto switchD_002c20da_caseD_19;
        pIVar14 = ValidationState_t::FindDef(_,uVar8);
        if (pIVar14 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x168,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        if (uVar6 == 3) goto LAB_002c2a6f;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected single constituent";
        lVar18 = 0x1b;
      }
    }
    break;
  case 0x51:
    local_25c = 0;
    sVar9 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_25c);
    uVar10 = local_25c;
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar8 = (inst->inst_).type_id;
    if (uVar8 != local_25c) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Result type (Op",0xf);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      local_238._M_dataplus._M_p = spvOpcodeString(OVar12);
      pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
      pcVar19 = ") does not match the type that results from indexing into the composite (Op";
LAB_002c2b6d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,pcVar19,0x4b);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
      local_258 = spvOpcodeString(OVar12);
      pDVar17 = DiagnosticStream::operator<<(pDVar17,&local_258);
      pcVar19 = ").";
      lVar18 = 2;
      goto LAB_002c2bad;
    }
    bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Cannot extract from a composite of 8- or 16-bit types";
LAB_002c2657:
    lVar18 = 0x35;
    break;
  case 0x52:
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if ((inst->inst_).type_id == uVar10) {
      local_25c = 0;
      sVar9 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_25c);
      uVar10 = local_25c;
      if (sVar9 != SPV_SUCCESS) {
        return sVar9;
      }
      if (uVar8 == local_25c) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
        if (!bVar4) {
          return SPV_SUCCESS;
        }
        bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar4) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Cannot insert into a composite of 8- or 16-bit types";
        goto LAB_002c2572;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"The Object type (Op",0x13);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      local_238._M_dataplus._M_p = spvOpcodeString(OVar12);
      pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
      pcVar19 = ") does not match the type that results from indexing into the Composite (Op";
      goto LAB_002c2b6d;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"The Result Type must be the same as Composite type in Op",0x38
              );
    local_238._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar17," yielding Result Id ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
    pcVar19 = ".";
    lVar18 = 1;
LAB_002c2bad:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,pcVar19,lVar18);
    local_208.error_ = pDVar17->error_;
    goto LAB_002c2dd2;
  case 0x53:
    uVar8 = (inst->inst_).type_id;
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    if (uVar10 == uVar8) {
      bVar4 = ValidationState_t::IsVoidType(_,uVar8);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "OpCopyObject cannot have void result type";
LAB_002c2b0b:
      lVar18 = 0x29;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type and Operand type to be the same";
LAB_002c2572:
      lVar18 = 0x34;
    }
    break;
  case 0x54:
    local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_25c = 0;
    local_24c = 0;
    bVar4 = ValidationState_t::GetMatrixTypeInfo
                      (_,(inst->inst_).type_id,(uint32_t *)&local_238,(uint32_t *)&local_258,
                       &local_25c,&local_24c);
    if (!bVar4) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a matrix type";
      goto LAB_002c259b;
    }
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
    local_23c = 0;
    local_240 = 0;
    local_20c = 0;
    local_244 = 0;
    bVar4 = ValidationState_t::GetMatrixTypeInfo
                      (_,uVar8,&local_23c,&local_240,&local_20c,&local_244);
    if (bVar4) {
      if (local_24c != local_244) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected component types of Matrix and Result Type to be "
                   ,0x39);
        pcVar19 = "identical";
        lVar18 = 9;
        break;
      }
      if (((uint32_t)local_238._M_dataplus._M_p != local_240) || ((uint32_t)local_258 != local_23c))
      {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected number of columns and the column size of Matrix "
                   ,0x39);
        pcVar19 = "to be the reverse of those of Result Type";
        goto LAB_002c2b0b;
      }
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Cannot transpose matrices of 16-bit floats";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Matrix to be of type OpTypeMatrix";
    }
LAB_002c2d81:
    lVar18 = 0x2a;
    break;
  default:
    if (uVar1 != 400) {
      return SPV_SUCCESS;
    }
    pIVar14 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar15 = ValidationState_t::FindDef(_,uVar6);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    if (((pIVar15 == pIVar14) || (pIVar14 == (Instruction *)0x0)) || (pIVar15 == (Instruction *)0x0)
       ) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Result Type must not equal the Operand type";
      goto LAB_002c2753;
    }
    bVar4 = ValidationState_t::LogicallyMatch(_,pIVar15,pIVar14,false);
    if (!bVar4) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Result Type does not logically match the Operand type";
      goto LAB_002c2657;
    }
    bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Cannot copy composites of 8- or 16-bit types";
    lVar18 = 0x2c;
  }
LAB_002c2dc0:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,lVar18);
LAB_002c2dd2:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}